

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D_adaptive<vector_realloc<unsigned_char*,16u>>
               (uchar **strings,size_t n,size_t depth,vector_realloc<unsigned_char_*,_16U> *buckets)

{
  undefined8 *puVar1;
  uchar *puVar2;
  long lVar3;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar4;
  size_t *psVar5;
  ushort uVar6;
  uchar **t;
  uchar **ppuVar7;
  uint i;
  size_t j_1;
  long lVar8;
  ulong uVar9;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_realloc<unsigned_char*,16u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    ppuVar7 = strings;
    do {
      lVar4 = 0;
      do {
        puVar2 = ppuVar7[lVar4];
        if (puVar2 == (uchar *)0x0) goto LAB_00205bf4;
        if (puVar2[depth] == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_58[lVar4] = uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      t = ppuVar7;
      do {
        vector_realloc<unsigned_char_*,_16U>::push_back(buckets + auStack_58[lVar4],t);
        lVar4 = lVar4 + 1;
        t = t + 1;
      } while (lVar4 != 0x10);
      uVar9 = uVar9 + 0x10;
      ppuVar7 = ppuVar7 + 0x10;
    } while (uVar9 < (n & 0xfffffffffffffff0));
  }
  lVar4 = n - uVar9;
  if (uVar9 <= n && lVar4 != 0) {
    ppuVar7 = strings + uVar9;
    do {
      puVar2 = *ppuVar7;
      if (puVar2 == (uchar *)0x0) {
LAB_00205bf4:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      vector_realloc<unsigned_char_*,_16U>::push_back(buckets + uVar9,ppuVar7);
      ppuVar7 = ppuVar7 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  psVar5 = &buckets->_size;
  lVar4 = 0;
  do {
    __ptr[lVar4] = *psVar5;
    lVar4 = lVar4 + 1;
    psVar5 = psVar5 + 3;
  } while (lVar4 != 0x10000);
  psVar5 = &buckets->_size;
  lVar4 = 0;
  lVar8 = 0;
  do {
    lVar3 = __ptr[lVar4];
    if (lVar3 != 0) {
      if (*psVar5 != 0) {
        memmove(strings + lVar8,((vector_realloc<unsigned_char_*,_16U> *)(psVar5 + -1))->_data,
                *psVar5 << 3);
      }
      lVar8 = lVar8 + lVar3;
    }
    lVar4 = lVar4 + 1;
    psVar5 = psVar5 + 3;
  } while (lVar4 != 0x10000);
  lVar4 = 0;
  do {
    free(*(void **)((long)&buckets->_data + lVar4));
    puVar1 = (undefined8 *)((long)&buckets->_data + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&buckets->_capacity + lVar4) = 0;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x180000);
  lVar4 = *__ptr;
  lVar8 = 1;
  do {
    n_00 = __ptr[lVar8];
    if (n_00 != 0) {
      if ((char)lVar8 != '\0') {
        msd_D_adaptive<vector_realloc<unsigned_char*,16u>>(strings + lVar4,n_00,depth + 2,buckets);
      }
      lVar4 = lVar4 + n_00;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}